

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O0

int64 __thiscall
libmatroska::KaxInternalBlock::GetDataPosition(KaxInternalBlock *this,size_t FrameNumber)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type local_28;
  size_t _Idx;
  int64 _Result;
  size_t FrameNumber_local;
  KaxInternalBlock *this_local;
  
  _Idx = 0xffffffffffffffff;
  bVar1 = libebml::EbmlElement::ValueIsSet((EbmlElement *)this);
  if ((bVar1) &&
     (sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->SizeList), FrameNumber < sVar2)) {
    _Idx = this->FirstFrameLocation;
    local_28 = 0;
    _Result = FrameNumber;
    while (_Result != 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->SizeList,local_28);
      _Idx = (long)*pvVar3 + _Idx;
      local_28 = local_28 + 1;
      _Result = _Result + -1;
    }
  }
  return _Idx;
}

Assistant:

int64 KaxInternalBlock::GetDataPosition(size_t FrameNumber)
{
  int64 _Result = -1;

  if (ValueIsSet() && FrameNumber < SizeList.size()) {
    _Result = FirstFrameLocation;

    size_t _Idx = 0;
    while(FrameNumber--) {
      _Result += SizeList[_Idx++];
    }
  }

  return _Result;
}